

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_aggregates.cpp
# Opt level: O0

void duckdb::DistinctFunctor::
     ListExecuteFunction<duckdb::FinalizeValueFunctor,signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>
               (Vector *result,Vector *state_vector,idx_t count)

{
  LogicalType *pLVar1;
  bool bVar2;
  idx_t iVar3;
  size_type sVar4;
  Vector *result_00;
  Vector *vec;
  ulong in_RDX;
  pair<const_signed_char,_unsigned_long> *entry;
  iterator __end0;
  iterator __begin0;
  unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
  *__range3;
  list_entry_t *list_entry;
  HistogramAggState<signed_char,_std::unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>_>
  *state_1;
  idx_t rid;
  idx_t i_1;
  idx_t current_offset;
  list_entry_t *list_entries;
  Vector *child_elements;
  HistogramAggState<signed_char,_std::unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>_>
  *state;
  idx_t i;
  idx_t new_entries;
  idx_t old_len;
  HistogramAggState<signed_char,_std::unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>_>
  **states;
  UnifiedVectorFormat sdata;
  Vector *in_stack_fffffffffffffed8;
  Vector *in_stack_fffffffffffffee0;
  Vector *in_stack_fffffffffffffef0;
  _Node_iterator_base<std::pair<const_signed_char,_unsigned_long>,_false> local_e8;
  _Node_iterator_base<std::pair<const_signed_char,_unsigned_long>,_false> local_e0;
  long local_d8;
  VectorType *local_d0;
  long *local_c8;
  ulong local_c0;
  ulong local_b8;
  idx_t local_b0;
  Vector *local_a8;
  Vector *local_a0;
  long *local_98;
  ulong local_90;
  long local_88;
  idx_t local_80;
  Vector *local_78;
  UnifiedVectorFormat *in_stack_ffffffffffffffa0;
  data_ptr_t in_stack_ffffffffffffffa8;
  Vector *in_stack_ffffffffffffffb0;
  
  UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)in_stack_fffffffffffffef0);
  Vector::ToUnifiedFormat
            (in_stack_ffffffffffffffb0,(idx_t)in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  local_78 = (Vector *)
             UnifiedVectorFormat::
             GetData<duckdb::HistogramAggState<signed_char,std::unordered_map<signed_char,unsigned_long,std::hash<signed_char>,std::equal_to<signed_char>,std::allocator<std::pair<signed_char_const,unsigned_long>>>>*>
                       ((UnifiedVectorFormat *)&stack0xffffffffffffffa0);
  local_80 = ListVector::GetListSize(in_stack_fffffffffffffed8);
  local_88 = 0;
  for (local_90 = 0; local_90 < in_RDX; local_90 = local_90 + 1) {
    in_stack_fffffffffffffef0 = local_78;
    iVar3 = SelectionVector::get_index((SelectionVector *)in_stack_ffffffffffffffa0,local_90);
    local_98 = *(long **)(&in_stack_fffffffffffffef0->vector_type + iVar3 * 8);
    if (*local_98 != 0) {
      sVar4 = ::std::
              unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
              ::size((unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
                      *)0x205c419);
      local_88 = sVar4 + local_88;
    }
  }
  ListVector::Reserve(in_stack_fffffffffffffee0,(idx_t)in_stack_fffffffffffffed8);
  result_00 = ListVector::GetEntry((Vector *)0x205c471);
  local_a0 = result_00;
  vec = (Vector *)FlatVector::GetData<duckdb::list_entry_t>((Vector *)0x205c492);
  local_b0 = local_80;
  local_a8 = vec;
  for (local_b8 = 0; local_b8 < in_RDX; local_b8 = local_b8 + 1) {
    local_c0 = local_b8;
    in_stack_fffffffffffffed8 = local_78;
    iVar3 = SelectionVector::get_index((SelectionVector *)in_stack_ffffffffffffffa0,local_b8);
    local_c8 = *(long **)(&in_stack_fffffffffffffed8->vector_type + iVar3 * 8);
    local_d0 = &local_a8->vector_type + local_c0 * 0x10;
    *(idx_t *)local_d0 = local_b0;
    if (*local_c8 == 0) {
      pLVar1 = (LogicalType *)(local_d0 + 8);
      pLVar1->id_ = INVALID;
      pLVar1->physical_type_ = ~INVALID;
      *(undefined6 *)&pLVar1->field_0x2 = 0;
    }
    else {
      local_d8 = *local_c8;
      local_e0._M_cur =
           (__node_type *)
           ::std::
           unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
           ::begin((unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
                    *)in_stack_fffffffffffffed8);
      local_e8._M_cur =
           (__node_type *)
           ::std::
           unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
           ::end((unordered_map<signed_char,_unsigned_long,_std::hash<signed_char>,_std::equal_to<signed_char>,_std::allocator<std::pair<const_signed_char,_unsigned_long>_>_>
                  *)in_stack_fffffffffffffed8);
      while (bVar2 = ::std::__detail::operator!=(&local_e0,&local_e8), bVar2) {
        ::std::__detail::_Node_iterator<std::pair<const_signed_char,_unsigned_long>,_false,_false>::
        operator*((_Node_iterator<std::pair<const_signed_char,_unsigned_long>,_false,_false> *)
                  0x205c594);
        FinalizeValueFunctor::HistogramFinalize<signed_char>
                  ((char)((ulong)in_stack_fffffffffffffef0 >> 0x38),result_00,(idx_t)vec);
        local_b0 = local_b0 + 1;
        ::std::__detail::_Node_iterator<std::pair<const_signed_char,_unsigned_long>,_false,_false>::
        operator++((_Node_iterator<std::pair<const_signed_char,_unsigned_long>,_false,_false> *)vec)
        ;
      }
      *(idx_t *)(local_d0 + 8) = local_b0 - *(idx_t *)local_d0;
    }
  }
  ListVector::SetListSize(vec,(idx_t)in_stack_fffffffffffffed8);
  Vector::Verify(in_stack_fffffffffffffef0,(idx_t)result_00);
  UnifiedVectorFormat::~UnifiedVectorFormat((UnifiedVectorFormat *)vec);
  return;
}

Assistant:

static void ListExecuteFunction(Vector &result, Vector &state_vector, idx_t count) {
		UnifiedVectorFormat sdata;
		state_vector.ToUnifiedFormat(count, sdata);
		auto states = UnifiedVectorFormat::GetData<HistogramAggState<T, MAP_TYPE> *>(sdata);

		auto old_len = ListVector::GetListSize(result);
		idx_t new_entries = 0;
		// figure out how much space we need
		for (idx_t i = 0; i < count; i++) {
			auto &state = *states[sdata.sel->get_index(i)];
			if (!state.hist) {
				continue;
			}
			new_entries += state.hist->size();
		}
		// reserve space in the list vector
		ListVector::Reserve(result, old_len + new_entries);
		auto &child_elements = ListVector::GetEntry(result);
		auto list_entries = FlatVector::GetData<list_entry_t>(result);

		idx_t current_offset = old_len;
		for (idx_t i = 0; i < count; i++) {
			const auto rid = i;
			auto &state = *states[sdata.sel->get_index(i)];
			auto &list_entry = list_entries[rid];
			list_entry.offset = current_offset;
			if (!state.hist) {
				list_entry.length = 0;
				continue;
			}

			for (auto &entry : *state.hist) {
				OP::template HistogramFinalize<T>(entry.first, child_elements, current_offset);
				current_offset++;
			}
			list_entry.length = current_offset - list_entry.offset;
		}
		D_ASSERT(current_offset == old_len + new_entries);
		ListVector::SetListSize(result, current_offset);
		result.Verify(count);
	}